

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void anon_unknown.dwarf_10d873::ClearLoadStoreInfo
               (VmModule *module,VariableData *container,uint storeOffset,uint storeSize)

{
  VmConstant *pVVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  LoadStoreInfo *pLVar6;
  LoadStoreInfo *pLVar7;
  LoadStoreInfo *pLVar8;
  LoadStoreInfo *pLVar9;
  ulong uVar10;
  byte bVar11;
  
  bVar11 = 0;
  if (storeSize == 0) {
    __assert_fail("storeSize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x565,
                  "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                 );
  }
  uVar4 = (module->loadStoreInfo).count;
  if (uVar4 != 0) {
    uVar5 = (storeOffset + storeSize) - 1;
    uVar10 = 0;
    do {
      pLVar6 = (module->loadStoreInfo).data;
      pLVar8 = pLVar6 + uVar10;
      pVVar1 = pLVar6[uVar10].loadAddress;
      if (pVVar1 == (VmConstant *)0x0) {
LAB_001a5cbf:
        pVVar1 = pLVar8->storeAddress;
        if (pVVar1 != (VmConstant *)0x0) {
          if (pLVar8->accessSize == 0) {
            __assert_fail("otherSize != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x582,
                          "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                         );
          }
          if (((pVVar1->container == container) && ((uint)pVVar1->iValue <= uVar5)) &&
             (storeOffset <= (pLVar8->accessSize + pVVar1->iValue) - 1)) goto LAB_001a5d4b;
        }
        if ((pLVar8->storePointer != (VmValue *)0x0 || pLVar8->loadPointer != (VmValue *)0x0) &&
           (bVar2 = HasAddressTaken(container), bVar2)) {
          uVar4 = (module->loadStoreInfo).count;
          if (uVar4 == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x172,
                          "T &SmallArray<VmModule::LoadStoreInfo, 32>::back() [T = VmModule::LoadStoreInfo, N = 32]"
                         );
          }
          if (uVar4 <= (uint)uVar10) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmModule::LoadStoreInfo, 32>::operator[](unsigned int) [T = VmModule::LoadStoreInfo, N = 32]"
                         );
          }
          pLVar8 = (module->loadStoreInfo).data;
          bVar2 = pLVar8[uVar4 - 1].noStoreOrNoContainerAlias;
          pLVar8[uVar10].noLoadOrNoContainerAlias = pLVar8[uVar4 - 1].noLoadOrNoContainerAlias;
          pLVar8[uVar10].noStoreOrNoContainerAlias = bVar2;
          pLVar6 = pLVar8 + (uVar4 - 1);
          pLVar8 = pLVar8 + uVar10;
          for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
            pLVar8->loadInst = pLVar6->loadInst;
            pLVar6 = (LoadStoreInfo *)((long)pLVar6 + ((ulong)bVar11 * -2 + 1) * 8);
            pLVar8 = (LoadStoreInfo *)((long)pLVar8 + ((ulong)bVar11 * -2 + 1) * 8);
          }
          goto LAB_001a5d6a;
        }
        uVar10 = (ulong)((uint)uVar10 + 1);
      }
      else {
        if (pLVar8->accessSize == 0) {
          __assert_fail("otherSize != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x571,
                        "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                       );
        }
        if (((pVVar1->container != container) || (uVar5 < (uint)pVVar1->iValue)) ||
           ((pLVar8->accessSize + pVVar1->iValue) - 1 < storeOffset)) goto LAB_001a5cbf;
LAB_001a5d4b:
        pLVar7 = pLVar6 + (uVar4 - 1);
        pLVar9 = pLVar8;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          pLVar9->loadInst = pLVar7->loadInst;
          pLVar7 = (LoadStoreInfo *)((long)pLVar7 + ((ulong)bVar11 * -2 + 1) * 8);
          pLVar9 = (LoadStoreInfo *)((long)pLVar9 + ((ulong)bVar11 * -2 + 1) * 8);
        }
        bVar2 = pLVar6[uVar4 - 1].noStoreOrNoContainerAlias;
        pLVar8->noLoadOrNoContainerAlias = pLVar6[uVar4 - 1].noLoadOrNoContainerAlias;
        pLVar8->noStoreOrNoContainerAlias = bVar2;
LAB_001a5d6a:
        uVar4 = (module->loadStoreInfo).count;
        if (uVar4 == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x183,
                        "void SmallArray<VmModule::LoadStoreInfo, 32>::pop_back() [T = VmModule::LoadStoreInfo, N = 32]"
                       );
        }
        (module->loadStoreInfo).count = uVar4 - 1;
      }
      uVar4 = (module->loadStoreInfo).count;
    } while ((uint)uVar10 < uVar4);
  }
  return;
}

Assistant:

void ClearLoadStoreInfo(VmModule *module, VariableData *container, unsigned storeOffset, unsigned storeSize)
	{
		assert(storeSize != 0);

		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			// Check load region intersection
			if(el.loadAddress)
			{
				unsigned otherOffset = unsigned(el.loadAddress->iValue);
				unsigned otherSize = el.accessSize;

				assert(otherSize != 0);

				// (a+aw >= b) && (a <= b+bw)
				if(container == el.loadAddress->container && storeOffset + storeSize - 1 >= otherOffset && storeOffset <= otherOffset + otherSize - 1)
				{
					module->loadStoreInfo[i] = module->loadStoreInfo.back();
					module->loadStoreInfo.pop_back();
					continue;
				}
			}

			// Check store region intersection
			if(el.storeAddress)
			{
				unsigned otherOffset = unsigned(el.storeAddress->iValue);
				unsigned otherSize = el.accessSize;

				assert(otherSize != 0);

				// (a+aw >= b) && (a <= b+bw)
				if(container == el.storeAddress->container && storeOffset + storeSize - 1 >= otherOffset && storeOffset <= otherOffset + otherSize - 1)
				{
					module->loadStoreInfo[i] = module->loadStoreInfo.back();
					module->loadStoreInfo.pop_back();
					continue;
				}
			}

			// Any opaque pointer might be clobbered
			if(el.loadPointer || el.storePointer)
			{
				// Unless it's impossible to have an opaque pointer to this container
				if(!HasAddressTaken(container))
				{
					i++;
					continue;
				}

				module->loadStoreInfo[i] = module->loadStoreInfo.back();
				module->loadStoreInfo.pop_back();
				continue;
			}

			i++;
		}
	}